

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* soplex::
  betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *th,Real epsilon)

{
  bool bVar1;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *val;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffb50;
  self_type *in_stack_fffffffffffffb58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb60;
  double in_stack_fffffffffffffb70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb80;
  undefined8 local_470;
  undefined1 local_468 [56];
  undefined1 local_430 [56];
  undefined8 local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f0;
  undefined8 local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  undefined1 local_340 [56];
  undefined8 local_308;
  undefined1 local_300 [56];
  undefined1 local_2c8 [56];
  undefined8 local_290;
  undefined1 local_288 [56];
  undefined8 local_250;
  undefined1 local_248 [56];
  undefined1 local_210 [80];
  undefined8 local_1c0;
  undefined8 *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 *local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined8 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined8 local_160;
  undefined8 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined1 *local_138;
  undefined8 local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_110;
  undefined1 *local_100;
  undefined1 *local_f0;
  undefined1 *local_d8;
  undefined1 *local_c8;
  undefined1 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  cpp_dec_float<50U,_int,_void> *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  cpp_dec_float<50U,_int,_void> *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_110 = local_210;
  val = in_RDI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
  local_250 = 0x3fb999999999999a;
  local_1b0 = local_248;
  local_1b8 = &local_250;
  local_1c0 = 0;
  local_88 = local_1b8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffb50,(double)val,in_RDI);
  bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  if (bVar1) {
    local_290 = 0x4024000000000000;
    local_198 = local_288;
    local_1a0 = &local_290;
    local_1a8 = 0;
    local_90 = local_1a0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffb50,(double)val,in_RDI);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator*=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  }
  else {
    local_100 = local_2c8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
    local_308 = 0x3feccccccccccccd;
    local_180 = local_300;
    local_188 = &local_308;
    local_190 = 0;
    local_98 = local_188;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffb50,(double)val,in_RDI);
    bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb70
                      );
    if (bVar1) {
      local_3b8 = 0x3ff0000000000000;
      local_168 = &local_3b0;
      local_170 = &local_3b8;
      local_178 = 0;
      local_a0 = local_170;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffb50,(double)val,in_RDI);
      local_28 = &local_378;
      local_38 = &local_3b0;
      local_30 = in_RSI;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_RSI,local_38);
      local_20 = &local_378;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
      local_8 = &local_378;
      local_10 = local_30;
      local_18 = local_38;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_RDI,in_RSI,(cpp_dec_float<50U,_int,_void> *)0x14648d);
      local_3f8 = 0x4000000000000000;
      local_150 = &local_3f0;
      local_158 = &local_3f8;
      local_160 = 0;
      local_a8 = local_158;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffb50,(double)val,in_RDI);
      local_68 = local_340;
      local_70 = &local_378;
      local_78 = &local_3f0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,local_70,local_78);
      local_60 = local_340;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
      local_48 = local_340;
      local_50 = local_70;
      local_58 = local_78;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_RDI,in_RSI,(cpp_dec_float<50U,_int,_void> *)0x1465ae);
      local_c8 = local_340;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
    }
    else {
      local_f0 = local_430;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
      local_470 = 0x3feff7ced916872b;
      local_138 = local_468;
      local_140 = &local_470;
      local_148 = 0;
      local_b0 = local_140;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffb50,(double)val,in_RDI);
      bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                         in_stack_fffffffffffffb70);
      if (bVar1) {
        local_120 = &stack0xfffffffffffffb58;
        local_128 = &stack0xfffffffffffffb50;
        local_130 = 0;
        local_b8 = local_128;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)0x3fefffeb074a771d,(double)val,in_RDI);
        local_d8 = &stack0xfffffffffffffb58;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(in_RDI,in_RSI);
      }
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI,in_RSI);
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)val;
}

Assistant:

static R betterThreshold(R th, Real epsilon)
{
   assert(th < R(1.0));

   if(LT(th, R(0.1), 1e-15))
      th *= R(10.0);
   else if(LT(th, R(0.9), epsilon))
      th = (th + R(1.0)) / R(2.0);
   else if(LT(th, R(0.999), epsilon))
      th = R(0.99999);

   assert(th < R(1.0));

   return th;
}